

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

int Acb_ObjRemoveDupFanins_int(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int *pFanins;
  int local_20;
  int k;
  int i;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  piVar2 = Acb_ObjFanins(p,iObj);
  local_20 = 0;
  do {
    iVar1 = local_20;
    if (*piVar2 <= local_20) {
      return 0;
    }
    while (pFanins._4_4_ = iVar1 + 1, pFanins._4_4_ < *piVar2) {
      iVar3 = iVar1 + 2;
      iVar1 = pFanins._4_4_;
      if (piVar2[local_20 + 1] == piVar2[iVar3]) {
        Acb_ObjRemoveDup(p,iObj,local_20,pFanins._4_4_);
        return 1;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int Acb_ObjRemoveDupFanins_int( Acb_Ntk_t * p, int iObj )
{
    int i, k, * pFanins = Acb_ObjFanins( p, iObj );
    for ( i = 0; i < pFanins[0]; i++ )
    for ( k = i+1; k < pFanins[0]; k++ )
    {
        if ( pFanins[1+i] != pFanins[1+k] )
            continue;
        Acb_ObjRemoveDup( p, iObj, i, k );
        return 1;
    }
    return 0;
}